

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O2

bool __thiscall
TCLAP::ValueArg<char>::processArg
          (ValueArg<char> *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  Visitor *pVVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  CmdLineParseException *this_00;
  ArgParseException *pAVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_a9;
  string local_a8;
  string local_88;
  string value;
  string flag;
  
  if ((((this->super_Arg)._ignoreable == true) && (Arg::ignoreRestRef()::ign != '\0')) ||
     (bVar3 = Arg::_hasBlanks(&this->super_Arg,
                              (args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + *i), bVar3)) {
    return false;
  }
  std::__cxx11::string::string
            ((string *)&flag,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + *i));
  std::__cxx11::string::string((string *)&value,"",(allocator *)&local_a8);
  __lhs = &value;
  (*(this->super_Arg)._vptr_Arg[10])(this,&flag,__lhs);
  iVar4 = (*(this->super_Arg)._vptr_Arg[6])(this,&flag);
  if ((char)iVar4 != '\0') {
    if ((this->super_Arg)._alreadySet == true) {
      bVar3 = (this->super_Arg)._xorSet;
      this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
      if (bVar3 != true) {
        std::__cxx11::string::string((string *)&local_a8,"Argument already set!",&local_a9);
        (*(this->super_Arg)._vptr_Arg[7])(&local_88,this);
        CmdLineParseException::CmdLineParseException(this_00,&local_a8,&local_88);
        __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
      }
      std::__cxx11::string::string
                ((string *)&local_a8,"Mutually exclusive argument already set!",&local_a9);
      (*(this->super_Arg)._vptr_Arg[7])(&local_88,this);
      CmdLineParseException::CmdLineParseException(this_00,&local_a8,&local_88);
      __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
    }
    if ((Arg::delimiterRef()::delim != ' ') && (bVar3 = std::operator==(&value,""), bVar3)) {
      pAVar6 = (ArgParseException *)__cxa_allocate_exception(0x68);
      std::__cxx11::string::string
                ((string *)&local_a8,"Couldn\'t find delimiter for this argument!",&local_a9);
      (*(this->super_Arg)._vptr_Arg[7])(&local_88,this);
      ArgParseException::ArgParseException(pAVar6,&local_a8,&local_88);
      __cxa_throw(pAVar6,&ArgParseException::typeinfo,ArgException::~ArgException);
    }
    bVar3 = std::operator==(__lhs,"");
    if (bVar3) {
      uVar5 = (long)*i + 1;
      *i = (int)uVar5;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
          (uVar5 & 0xffffffff)) {
        pAVar6 = (ArgParseException *)__cxa_allocate_exception(0x68);
        std::__cxx11::string::string
                  ((string *)&local_a8,"Missing a value for this argument!",&local_a9);
        (*(this->super_Arg)._vptr_Arg[7])(&local_88,this);
        ArgParseException::ArgParseException(pAVar6,&local_a8,&local_88);
        __cxa_throw(pAVar6,&ArgParseException::typeinfo,ArgException::~ArgException);
      }
      __lhs = pbVar1 + uVar5;
    }
    _extractValue(this,__lhs);
    (this->super_Arg)._alreadySet = true;
    pVVar2 = (this->super_Arg)._visitor;
    if (pVVar2 != (Visitor *)0x0) {
      (*pVVar2->_vptr_Visitor[2])();
    }
  }
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&flag);
  return (bool)(char)iVar4;
}

Assistant:

bool ValueArg<T>::processArg(int *i, std::vector<std::string>& args)
{
  if ( _ignoreable && Arg::ignoreRest() )
    return false;

  if ( _hasBlanks( args[*i] ) )
    return false;

  std::string flag = args[*i];

  std::string value = "";
  trimFlag( flag, value );

  if ( argMatches( flag ) )
    {
      if ( _alreadySet )
        {
          if ( _xorSet )
            throw( CmdLineParseException("Mutually exclusive argument"
                                         " already set!", toString()));
          else
            throw( CmdLineParseException("Argument already set!", 
                                         toString()) );
        }

      if ( Arg::delimiter() != ' ' && value == "" )
        throw( ArgParseException("Couldn't find delimiter for this argument!",
                                 toString() ) );

      if ( value == "" )
        {
          (*i)++;
          if ( static_cast<unsigned int>(*i) < args.size() ) 
            _extractValue( args[*i] );
          else
            throw( ArgParseException("Missing a value for this argument!",
                                     toString() ) );
        }
      else
        _extractValue( value );
                                
      _alreadySet = true;
      _checkWithVisitor();
      return true;
    }   
  else
    return false;
}